

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdn.c
# Opt level: O3

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret)

{
  int iVar1;
  _Qiniu_CDN_LogListData *addr;
  long lVar2;
  long lVar3;
  
  addr = ret->data;
  if (addr != (_Qiniu_CDN_LogListData *)0x0) {
    iVar1 = ret->domainsCount;
    if (0 < iVar1) {
      lVar2 = 0x10;
      lVar3 = 0;
      do {
        if (0 < *(int *)((long)ret->data + lVar2 + -8)) {
          Qiniu_Free(*(void **)((long)&ret->data->domain + lVar2));
          iVar1 = ret->domainsCount;
        }
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x18;
      } while (lVar3 < iVar1);
      addr = ret->data;
    }
    Qiniu_Free(addr);
    return;
  }
  return;
}

Assistant:

void Qiniu_Free_CDNLogListRet(Qiniu_CDN_LogListRet *ret) {
    int i;
    if (ret->data != NULL) {
        for (i = 0; i < ret->domainsCount; i++) {
            if (ret->data[i].itemsCount > 0) {
                Qiniu_Free(ret->data[i].items);
            }
        }
        Qiniu_Free(ret->data);
    }
}